

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
at<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,int index)

{
  LogMessage *pLVar1;
  Type *pTVar2;
  LogFinisher local_a2;
  byte local_a1;
  LogMessage local_a0;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  int local_14;
  RepeatedPtrFieldBase *pRStack_10;
  int index_local;
  RepeatedPtrFieldBase *this_local;
  
  local_51 = 0;
  local_14 = index;
  pRStack_10 = this;
  if (index < 0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x6b8);
    local_51 = 1;
    pLVar1 = LogMessage::operator<<(&local_50,"CHECK failed: (index) >= (0): ");
    LogFinisher::operator=(local_65,pLVar1);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
  }
  local_a1 = 0;
  if (this->current_size_ <= local_14) {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x6b9);
    local_a1 = 1;
    pLVar1 = LogMessage::operator<<(&local_a0,"CHECK failed: (index) < (current_size_): ");
    LogFinisher::operator=(&local_a2,pLVar1);
  }
  if ((local_a1 & 1) != 0) {
    LogMessage::~LogMessage(&local_a0);
  }
  pTVar2 = cast<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (this->rep_->elements[local_14]);
  return pTVar2;
}

Assistant:

inline typename TypeHandler::Type& RepeatedPtrFieldBase::at(int index) {
  GOOGLE_CHECK_GE(index, 0);
  GOOGLE_CHECK_LT(index, current_size_);
  return *cast<TypeHandler>(rep_->elements[index]);
}